

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDisallowedCommand.h
# Opt level: O3

void __thiscall cmDisallowedCommand::~cmDisallowedCommand(cmDisallowedCommand *this)

{
  ~cmDisallowedCommand(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

~cmDisallowedCommand() override { delete this->Command; }